

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O1

int fy_emit_document(fy_emitter *emit,fy_document *fyd)

{
  int iVar1;
  int iVar2;
  
  iVar1 = fy_emit_document_start(emit,fyd,(fy_node *)0x0);
  iVar2 = -1;
  if (iVar1 == 0) {
    iVar2 = fy_emit_root_node(emit,fyd->root);
    if (iVar2 == 0) {
      iVar1 = fy_emit_common_document_end(emit);
      iVar2 = -1;
      if (iVar1 == 0) {
        emit->fyd = (fy_document *)0x0;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int fy_emit_document(struct fy_emitter *emit, struct fy_document *fyd) {
    int rc;

    rc = fy_emit_document_start(emit, fyd, NULL);
    if (rc)
        return rc;

    rc = fy_emit_root_node(emit, fyd->root);
    if (rc)
        return rc;

    rc = fy_emit_document_end(emit);

    return rc;
}